

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2_smt.c
# Opt level: O3

MPP_RET rc_model_v2_smt_check_reenc(void *ctx,EncRcTask *task)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  MPP_RET MVar4;
  int iVar5;
  char *fmt;
  uint uVar6;
  
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2_smt","enter ctx %p cfg %p\n","rc_model_v2_smt_check_reenc",ctx,
               &task->info);
  }
  pbVar1 = (byte *)((long)&task->frm + 4);
  *pbVar1 = *pbVar1 & 0xfb;
  if (*(int *)((long)ctx + 8) == 2) {
    return MPP_OK;
  }
  if (((task->force).force_flag & 1) != 0) {
    return MPP_OK;
  }
  if (*(int *)((long)ctx + 0x2a4) != 0) {
    return MPP_OK;
  }
  if (*(int *)((long)ctx + 0x2a8) != 0) {
    return MPP_OK;
  }
  MVar4 = check_re_enc_smt((RcModelV2SmtCtx *)ctx,&task->info);
  if (MVar4 == MPP_OK) {
    return MPP_OK;
  }
  uVar6 = 0;
  if (((ulong)task->frm & 0x10) == 0) {
    uVar6 = *(uint *)((long)ctx + 0xac);
  }
  if ((*(uint *)((long)ctx + 0xb4) != 0) &&
     (*(uint *)((long)ctx + 0xb4) <= *(uint *)((long)ctx + 0x2a0))) {
    uVar6 = 0;
  }
  if ((rc_debug._1_1_ & 2) != 0) {
    _mpp_log_l(4,"rc_model_v2_smt","reenc drop_mode %d drop_cnt %d\n",(char *)0x0,(ulong)uVar6,
               (ulong)*(uint *)((long)ctx + 0x2a0));
  }
  if (uVar6 == 2) {
    pbVar1 = (byte *)((long)&task->frm + 4);
    *pbVar1 = *pbVar1 | 0x14;
    *(undefined4 *)((long)ctx + 0x2a8) = 1;
    *(int *)((long)ctx + 0x2a0) = *(int *)((long)ctx + 0x2a0) + 1;
    if ((rc_debug._1_1_ & 2) == 0) {
      return MPP_OK;
    }
    fmt = "force_pskip\n";
LAB_0023deb1:
    _mpp_log_l(4,"rc_model_v2_smt",fmt,(char *)0x0);
    return MPP_OK;
  }
  if (uVar6 == 1) {
    pbVar1 = (byte *)((long)&task->frm + 4);
    *pbVar1 = *pbVar1 | 5;
    *(undefined4 *)((long)ctx + 0x2a4) = 1;
    *(int *)((long)ctx + 0x2a0) = *(int *)((long)ctx + 0x2a0) + 1;
    if ((rc_debug._1_1_ & 2) == 0) {
      return MPP_OK;
    }
    fmt = "drop\n";
    goto LAB_0023deb1;
  }
  iVar2 = *(int *)((long)ctx + (ulong)(*(int *)((long)ctx + 0x104) != 2) * 4 + 0xbc);
  iVar3 = (task->info).bit_real;
  if (iVar3 == iVar2 * 2 || SBORROW4(iVar3,iVar2 * 2) != iVar3 + iVar2 * -2 < 0) {
    if ((iVar2 * 3) / 2 < iVar3) {
      iVar5 = (task->info).quality_target + 2;
    }
    else {
      iVar5 = (task->info).quality_target;
      if (iVar3 <= iVar2) goto LAB_0023df21;
      iVar5 = iVar5 + 1;
    }
  }
  else {
    iVar5 = (task->info).quality_target + 3;
  }
  (task->info).quality_target = iVar5;
LAB_0023df21:
  if (iVar5 < (task->info).quality_max) {
    *(int *)((long)ctx + 0x29c) = *(int *)((long)ctx + 0x29c) + 1;
    pbVar1 = (byte *)((long)&task->frm + 4);
    *pbVar1 = *pbVar1 | 4;
  }
  *(undefined4 *)((long)ctx + 0x2a0) = 0;
  return MPP_OK;
}

Assistant:

MPP_RET rc_model_v2_smt_check_reenc(void *ctx, EncRcTask *task)
{
    RcModelV2SmtCtx *p = (RcModelV2SmtCtx *)ctx;
    EncRcTaskInfo *cfg = (EncRcTaskInfo *)&task->info;
    EncFrmStatus *frm = &task->frm;
    RcCfg *usr_cfg = &p->usr_cfg;

    rc_dbg_func("enter ctx %p cfg %p\n", ctx, cfg);

    frm->reencode = 0;

    if ((usr_cfg->mode == RC_FIXQP) ||
        (task->force.force_flag & ENC_RC_FORCE_QP) ||
        p->on_drop || p->on_pskip)
        return MPP_OK;

    if (check_re_enc_smt(p, cfg)) {
        MppEncRcDropFrmMode drop_mode = usr_cfg->drop_mode;

        if (frm->is_intra)
            drop_mode = MPP_ENC_RC_DROP_FRM_DISABLED;

        if (usr_cfg->drop_gap && p->drop_cnt >= usr_cfg->drop_gap)
            drop_mode = MPP_ENC_RC_DROP_FRM_DISABLED;

        rc_dbg_drop("reenc drop_mode %d drop_cnt %d\n", drop_mode, p->drop_cnt);

        switch (drop_mode) {
        case MPP_ENC_RC_DROP_FRM_NORMAL : {
            frm->drop = 1;
            frm->reencode = 1;
            p->on_drop = 1;
            p->drop_cnt++;
            rc_dbg_drop("drop\n");
        } break;
        case MPP_ENC_RC_DROP_FRM_PSKIP : {
            frm->force_pskip = 1;
            frm->reencode = 1;
            p->on_pskip = 1;
            p->drop_cnt++;
            rc_dbg_drop("force_pskip\n");
        } break;
        case MPP_ENC_RC_DROP_FRM_DISABLED :
        default : {
            RK_S32 bits_thr = usr_cfg->super_cfg.super_p_thd;
            if (p->frame_type == INTRA_FRAME)
                bits_thr = usr_cfg->super_cfg.super_i_thd;

            if (cfg->bit_real > bits_thr * 2)
                cfg->quality_target += 3;
            else if (cfg->bit_real > bits_thr * 3 / 2)
                cfg->quality_target += 2;
            else if (cfg->bit_real > bits_thr)
                cfg->quality_target ++;

            if (cfg->quality_target < cfg->quality_max) {
                p->reenc_cnt++;
                frm->reencode = 1;
            }
            p->drop_cnt = 0;
        } break;
        }
    }

    return MPP_OK;
}